

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<BreakStatementAstNode>_> * __thiscall
Parser::parseBreakStatement
          (optional<std::shared_ptr<BreakStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined1 local_70 [24];
  shared_ptr<Token> breakToken;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  allocator<char> local_2a;
  char local_29;
  bool error;
  
  local_29 = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,"Expected a break",&local_2a);
  expect((Parser *)(local_70 + 0x10),(TokenType)this,(bool *)0xb,(string *)&local_29);
  std::__cxx11::string::~string
            ((string *)&breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  skipWhiteSpace(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,"Expected a semicolon after break",&local_2a);
  expect((Parser *)local_70,(TokenType)this,(bool *)0x10,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  std::__cxx11::string::~string
            ((string *)&breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  if (local_29 == '\x01') {
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BreakStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BreakStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_>._M_engaged = false;
  }
  else {
    std::make_shared<BreakStatementAstNode,std::shared_ptr<Token>&>
              ((shared_ptr<Token> *)
               &breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var1._M_pi = local_48[0]._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BreakStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BreakStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<BreakStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_48[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BreakStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BreakStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<BreakStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var1._M_pi;
    breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BreakStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BreakStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_>._M_engaged = true;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&breakToken);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<BreakStatementAstNode>>
Parser::parseBreakStatement() noexcept {
  bool error = false;

  auto breakToken = this->expect(TokenType::Break, error, "Expected a break");

  this->skipWhiteSpace();

  this->expect(TokenType::SemiColon, error, "Expected a semicolon after break");

  if (error) { return std::nullopt; }

  return std::make_shared<BreakStatementAstNode>(breakToken);
}